

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCMakeProjects
          (cmCPackGenerator *this,bool setDestDir,string *baseTempInstallDirectory,
          mode_t *default_dir_mode)

{
  pointer pcVar1;
  cmCPackLog *pcVar2;
  long lVar3;
  size_type sVar4;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  cmValue cVar9;
  cmValue cVar10;
  ulong uVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmake *gname;
  ostream *poVar12;
  size_t sVar13;
  long *plVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  byte bVar17;
  string *installType;
  pointer pbVar18;
  _Alloc_hider _Var19;
  pointer pbVar20;
  pointer pbVar21;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string componentsVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buildConfigs;
  undefined1 local_320 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentsVector;
  cmCPackInstallCMakeProject project;
  string installProjectName;
  string installDirectory;
  string absoluteDestFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeProjectsVector;
  ostringstream cmCPackLog_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  _cmCPackLog_msg = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_CMAKE_PROJECTS","");
  cVar9 = GetOption(this,(string *)&cmCPackLog_msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_cmCPackLog_msg != local_198) {
    operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
  }
  _cmCPackLog_msg = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmCPackLog_msg,"CPACK_CMAKE_GENERATOR","");
  cVar10 = GetOption(this,(string *)&cmCPackLog_msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_cmCPackLog_msg != local_198) {
    operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
  }
  absoluteDestFiles._M_dataplus._M_p = (pointer)&absoluteDestFiles.field_2;
  absoluteDestFiles._M_string_length = 0;
  absoluteDestFiles.field_2._M_local_buf[0] = '\0';
  if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
    if (cVar10.Value == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&cmCPackLog_msg,
                 "CPACK_INSTALL_CMAKE_PROJECTS is specified, but CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR is required to install the project."
                 ,0x86);
      std::ios::widen((char)&cmCPackLog_msg + (char)*(undefined8 *)(_cmCPackLog_msg + -0x18));
      std::ostream::put((char)&cmCPackLog_msg);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var19 = project.Directory._M_dataplus;
      sVar13 = strlen(project.Directory._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x225,_Var19._M_p,sVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)project.Directory._M_dataplus._M_p != &project.Directory.field_2) {
        operator_delete(project.Directory._M_dataplus._M_p,
                        CONCAT71(project.Directory.field_2._M_allocated_capacity._1_7_,
                                 project.Directory.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::ios_base::~ios_base(local_138);
      iVar8 = 0;
      goto LAB_001660c8;
    }
    arg._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar9.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&cmakeProjectsVector,arg,false);
    if (cmakeProjectsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        cmakeProjectsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar21 = cmakeProjectsVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (((pbVar21 + 1 ==
              cmakeProjectsVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) ||
            (pbVar21 + 2 ==
             cmakeProjectsVector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) ||
           (pbVar21 + 3 ==
            cmakeProjectsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&cmCPackLog_msg,
                     "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install directory, install project name, install component, and install subdirectory."
                     ,0xc4);
          std::ios::widen((char)&cmCPackLog_msg + (char)*(undefined8 *)(_cmCPackLog_msg + -0x18));
          std::ostream::put((char)&cmCPackLog_msg);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var19 = project.Directory._M_dataplus;
          sVar13 = strlen(project.Directory._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x236,_Var19._M_p,sVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)project.Directory._M_dataplus._M_p != &project.Directory.field_2) {
            operator_delete(project.Directory._M_dataplus._M_p,
                            CONCAT71(project.Directory.field_2._M_allocated_capacity._1_7_,
                                     project.Directory.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          std::ios_base::~ios_base(local_138);
LAB_001661db:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&cmakeProjectsVector);
          iVar8 = 0;
          goto LAB_001660c8;
        }
        installDirectory._M_dataplus._M_p = (pointer)&installDirectory.field_2;
        pcVar1 = (pbVar21->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&installDirectory,pcVar1,pcVar1 + pbVar21->_M_string_length);
        installProjectName._M_dataplus._M_p = (pointer)&installProjectName.field_2;
        pcVar1 = pbVar21[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&installProjectName,pcVar1,pcVar1 + pbVar21[1]._M_string_length);
        project.Directory._M_dataplus._M_p = (pointer)&project.Directory.field_2;
        project.Directory._M_string_length = 0;
        project.Directory.field_2._M_local_buf[0] = '\0';
        project.ProjectName._M_dataplus._M_p = (pointer)&project.ProjectName.field_2;
        project.ProjectName._M_string_length = 0;
        project.ProjectName.field_2._M_local_buf[0] = '\0';
        project.Component._M_dataplus._M_p = (pointer)&project.Component.field_2;
        project.Component._M_string_length = 0;
        project.Component.field_2._M_local_buf[0] = '\0';
        project.SubDirectory._M_dataplus._M_p = (pointer)&project.SubDirectory.field_2;
        project.SubDirectory._M_string_length = 0;
        project.SubDirectory.field_2._M_local_buf[0] = '\0';
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)&project);
        std::__cxx11::string::_M_assign((string *)&project.ProjectName);
        std::__cxx11::string::_M_assign((string *)&project.Component);
        std::__cxx11::string::_M_assign((string *)&project.SubDirectory);
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar8 = (*this->_vptr_cmCPackGenerator[0x18])(this);
        if ((char)iVar8 == '\0') {
LAB_00165712:
          bVar17 = 0;
        }
        else {
          _cmCPackLog_msg = (pointer)local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&cmCPackLog_msg,"CPACK_MONOLITHIC_INSTALL","");
          bVar7 = IsOn(this,(string *)&cmCPackLog_msg);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_cmCPackLog_msg != local_198) {
            operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
          }
          if (bVar7) goto LAB_00165712;
          cmsys::SystemTools::UpperCase((string *)&buildConfigs,&project.Component);
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)&buildConfigs,0,(char *)0x0,0x6c9a68);
          componentsVar._M_dataplus._M_p = (pointer)&componentsVar.field_2;
          psVar15 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar15) {
            componentsVar.field_2._M_allocated_capacity = *psVar15;
            componentsVar.field_2._8_8_ = plVar14[3];
          }
          else {
            componentsVar.field_2._M_allocated_capacity = *psVar15;
            componentsVar._M_dataplus._M_p = (pointer)*plVar14;
          }
          componentsVar._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&componentsVar);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 == paVar16) {
            local_198[0]._0_8_ = paVar16->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar14[3];
            _cmCPackLog_msg = (pointer)local_198;
          }
          else {
            local_198[0]._0_8_ = paVar16->_M_allocated_capacity;
            _cmCPackLog_msg = (pointer)*plVar14;
          }
          *plVar14 = (long)paVar16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)componentsVar._M_dataplus._M_p != &componentsVar.field_2) {
            operator_delete(componentsVar._M_dataplus._M_p,
                            componentsVar.field_2._M_allocated_capacity + 1);
          }
          if (buildConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&buildConfigs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(buildConfigs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((buildConfigs.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          cVar9 = GetOption(this,(string *)&cmCPackLog_msg);
          if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
            arg_00._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
            arg_00._M_len = (cVar9.Value)->_M_string_length;
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&componentsVar,arg_00,false);
            sVar4 = componentsVar._M_string_length;
            for (_Var19 = componentsVar._M_dataplus; _Var19._M_p != (pointer)sVar4;
                _Var19._M_p = _Var19._M_p + 0x20) {
              iVar8 = (*this->_vptr_cmCPackGenerator[0x1a])(this,&project.ProjectName,_Var19._M_p);
              buildConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar8);
              std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
              emplace_back<cmCPackInstallationType*>
                        ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>
                          *)&project.InstallationTypes,(cmCPackInstallationType **)&buildConfigs);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&componentsVar);
          }
          cmsys::SystemTools::UpperCase((string *)&buildConfigs,&project.Component);
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)&buildConfigs,0,(char *)0x0,0x6c9a7e);
          componentsVar._M_dataplus._M_p = (pointer)&componentsVar.field_2;
          psVar15 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar15) {
            componentsVar.field_2._M_allocated_capacity = *psVar15;
            componentsVar.field_2._8_8_ = plVar14[3];
          }
          else {
            componentsVar.field_2._M_allocated_capacity = *psVar15;
            componentsVar._M_dataplus._M_p = (pointer)*plVar14;
          }
          componentsVar._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if (buildConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&buildConfigs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(buildConfigs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((buildConfigs.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          cVar9 = GetOption(this,&componentsVar);
          if ((cVar9.Value == (string *)0x0) || ((cVar9.Value)->_M_string_length == 0)) {
            bVar17 = 0;
          }
          else {
            arg_02._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
            arg_02._M_len = (cVar9.Value)->_M_string_length;
            cmExpandList(arg_02,&componentsVector,false);
            pbVar5 = componentsVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar17 = 1;
            for (pbVar20 = componentsVector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar5;
                pbVar20 = pbVar20 + 1) {
              iVar8 = (*this->_vptr_cmCPackGenerator[0x1b])(this,&project.ProjectName,pbVar20);
              buildConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar8);
              std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
              emplace_back<cmCPackComponent*>
                        ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                         &project.Components,(cmCPackComponent **)&buildConfigs);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)componentsVar._M_dataplus._M_p != &componentsVar.field_2) {
            operator_delete(componentsVar._M_dataplus._M_p,
                            componentsVar.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_cmCPackLog_msg != local_198) {
            operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
          }
        }
        if (componentsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            componentsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&componentsVector,&project.Component);
        }
        buildConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        buildConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        buildConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _cmCPackLog_msg = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&cmCPackLog_msg,"CPACK_BUILD_CONFIG","");
        cVar9 = GetOption(this,(string *)&cmCPackLog_msg);
        if (cVar9.Value != (string *)0x0) {
          arg_01._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
          arg_01._M_len = (cVar9.Value)->_M_string_length;
          cmExpandList(arg_01,&buildConfigs,false);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_cmCPackLog_msg != local_198) {
          operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
        }
        pbVar20 = buildConfigs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = buildConfigs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (buildConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            buildConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar11 = (long)buildConfigs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)buildConfigs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar3 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (buildConfigs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     buildConfigs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar5,pbVar20);
        }
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (buildConfigs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             buildConfigs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&buildConfigs,(iterator)__first._M_current,
                   (iterator)
                   buildConfigs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        if (buildConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            buildConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&buildConfigs);
        }
        gname = cmMakefile::GetCMakeInstance(this->MakefileMap);
        cmake::CreateGlobalGenerator((cmake *)local_320,(string *)gname,SUB81(cVar10.Value,0));
        pbVar5 = buildConfigs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_320 == (undefined1  [8])0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&cmCPackLog_msg,
                     "Specified package generator not found. CPACK_CMAKE_GENERATOR value is invalid."
                     ,0x4e);
          std::ios::widen((char)*(undefined8 *)(_cmCPackLog_msg + -0x18) + (char)&cmCPackLog_msg);
          std::ostream::put((char)&cmCPackLog_msg);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var19 = componentsVar._M_dataplus;
          sVar13 = strlen(componentsVar._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x284,_Var19._M_p,sVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)componentsVar._M_dataplus._M_p != &componentsVar.field_2) {
            operator_delete(componentsVar._M_dataplus._M_p,
                            componentsVar.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          std::ios_base::~ios_base(local_138);
LAB_00165b40:
          bVar7 = false;
        }
        else {
          cmSystemTools::s_ForceUnixPaths =
               *(bool *)((long)&(((pointer)((long)local_320 + 0x6e0))->_M_t).
                                super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                _M_head_impl + 6);
          for (pbVar20 = buildConfigs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar5;
              pbVar20 = pbVar20 + 1) {
            iVar8 = (*this->_vptr_cmCPackGenerator[0x14])
                              (this,&project.ProjectName,&project,local_320,pbVar20);
            if (iVar8 == 0) goto LAB_00165b40;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&cmCPackLog_msg,"- Install project: ",0x13);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&cmCPackLog_msg,project.ProjectName._M_dataplus._M_p,
                                 project.ProjectName._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," [",2);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pbVar20->_M_dataplus)._M_p,pbVar20->_M_string_length);
            componentsVar._M_dataplus._M_p._0_1_ = 0x5d;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)&componentsVar,1);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var19 = componentsVar._M_dataplus;
            sVar13 = strlen(componentsVar._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x296,_Var19._M_p,sVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)componentsVar._M_dataplus._M_p != &componentsVar.field_2) {
              operator_delete(componentsVar._M_dataplus._M_p,
                              componentsVar.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            std::ios_base::~ios_base(local_138);
            pbVar6 = componentsVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar18 = componentsVector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar6;
                pbVar18 = pbVar18 + 1) {
              iVar8 = (*this->_vptr_cmCPackGenerator[0x15])
                                (this,(ulong)setDestDir,&project,baseTempInstallDirectory,
                                 default_dir_mode,pbVar18,(ulong)bVar17,&project.SubDirectory,
                                 pbVar20,&absoluteDestFiles);
              if (iVar8 == 0) {
                bVar7 = false;
                goto LAB_00165b4e;
              }
            }
          }
          bVar7 = true;
          std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>::
          emplace_back<cmCPackInstallCMakeProject>(&this->CMakeProjects,&project);
        }
LAB_00165b4e:
        if (local_320 != (undefined1  [8])0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)local_320)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&buildConfigs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&componentsVector);
        if (project.Components.
            super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(project.Components.
                          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)project.Components.
                                super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)project.Components.
                                super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (project.InstallationTypes.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(project.InstallationTypes.
                          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)project.InstallationTypes.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)project.InstallationTypes.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.SubDirectory._M_dataplus._M_p != &project.SubDirectory.field_2) {
          operator_delete(project.SubDirectory._M_dataplus._M_p,
                          CONCAT71(project.SubDirectory.field_2._M_allocated_capacity._1_7_,
                                   project.SubDirectory.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.Component._M_dataplus._M_p != &project.Component.field_2) {
          operator_delete(project.Component._M_dataplus._M_p,
                          CONCAT71(project.Component.field_2._M_allocated_capacity._1_7_,
                                   project.Component.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.ProjectName._M_dataplus._M_p != &project.ProjectName.field_2) {
          operator_delete(project.ProjectName._M_dataplus._M_p,
                          CONCAT71(project.ProjectName.field_2._M_allocated_capacity._1_7_,
                                   project.ProjectName.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)project.Directory._M_dataplus._M_p != &project.Directory.field_2) {
          operator_delete(project.Directory._M_dataplus._M_p,
                          CONCAT71(project.Directory.field_2._M_allocated_capacity._1_7_,
                                   project.Directory.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)installProjectName._M_dataplus._M_p != &installProjectName.field_2) {
          operator_delete(installProjectName._M_dataplus._M_p,
                          installProjectName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)installDirectory._M_dataplus._M_p != &installDirectory.field_2) {
          operator_delete(installDirectory._M_dataplus._M_p,
                          installDirectory.field_2._M_allocated_capacity + 1);
        }
        if (!bVar7) goto LAB_001661db;
        pbVar21 = pbVar21 + 4;
      } while (pbVar21 !=
               cmakeProjectsVector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmakeProjectsVector);
  }
  _cmCPackLog_msg = (pointer)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cmCPackLog_msg,"CPACK_ABSOLUTE_DESTINATION_FILES","");
  StoreOption<cmValue>(this,(string *)&cmCPackLog_msg,&absoluteDestFiles);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_cmCPackLog_msg != local_198) {
    operator_delete(_cmCPackLog_msg,local_198[0]._M_allocated_capacity + 1);
  }
  iVar8 = 1;
LAB_001660c8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)absoluteDestFiles._M_dataplus._M_p != &absoluteDestFiles.field_2) {
    operator_delete(absoluteDestFiles._M_dataplus._M_p,
                    CONCAT71(absoluteDestFiles.field_2._M_allocated_capacity._1_7_,
                             absoluteDestFiles.field_2._M_local_buf[0]) + 1);
  }
  return iVar8;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCMakeProjects(
  bool setDestDir, const std::string& baseTempInstallDirectory,
  const mode_t* default_dir_mode)
{
  cmValue cmakeProjects = this->GetOption("CPACK_INSTALL_CMAKE_PROJECTS");
  cmValue cmakeGenerator = this->GetOption("CPACK_CMAKE_GENERATOR");
  std::string absoluteDestFiles;
  if (cmNonempty(cmakeProjects)) {
    if (!cmakeGenerator) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_INSTALL_CMAKE_PROJECTS is specified, but "
                    "CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR "
                    "is required to install the project."
                      << std::endl);
      return 0;
    }
    std::vector<std::string> cmakeProjectsVector =
      cmExpandedList(cmakeProjects);
    std::vector<std::string>::iterator it;
    for (it = cmakeProjectsVector.begin(); it != cmakeProjectsVector.end();
         ++it) {
      if (it + 1 == cmakeProjectsVector.end() ||
          it + 2 == cmakeProjectsVector.end() ||
          it + 3 == cmakeProjectsVector.end()) {
        cmCPackLogger(
          cmCPackLog::LOG_ERROR,
          "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. "
          "CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install "
          "directory, install project name, install component, and install "
          "subdirectory."
            << std::endl);
        return 0;
      }
      std::string installDirectory = *it;
      ++it;
      std::string installProjectName = *it;
      ++it;
      cmCPackInstallCMakeProject project;

      project.Directory = installDirectory;
      project.ProjectName = installProjectName;
      project.Component = *it;
      ++it;
      project.SubDirectory = *it;

      std::vector<std::string> componentsVector;

      bool componentInstall = false;
      /*
       * We do a component install iff
       *    - the CPack generator support component
       *    - the user did not request Monolithic install
       *      (this works at CPack time too)
       */
      if (this->SupportsComponentInstallation() &&
          !(this->IsOn("CPACK_MONOLITHIC_INSTALL"))) {
        // Determine the installation types for this project (if provided).
        std::string installTypesVar = "CPACK_" +
          cmSystemTools::UpperCase(project.Component) + "_INSTALL_TYPES";
        cmValue installTypes = this->GetOption(installTypesVar);
        if (cmNonempty(installTypes)) {
          std::vector<std::string> installTypesVector =
            cmExpandedList(installTypes);
          for (std::string const& installType : installTypesVector) {
            project.InstallationTypes.push_back(
              this->GetInstallationType(project.ProjectName, installType));
          }
        }

        // Determine the set of components that will be used in this project
        std::string componentsVar =
          "CPACK_COMPONENTS_" + cmSystemTools::UpperCase(project.Component);
        cmValue components = this->GetOption(componentsVar);
        if (cmNonempty(components)) {
          cmExpandList(components, componentsVector);
          for (std::string const& comp : componentsVector) {
            project.Components.push_back(
              this->GetComponent(project.ProjectName, comp));
          }
          componentInstall = true;
        }
      }
      if (componentsVector.empty()) {
        componentsVector.push_back(project.Component);
      }

      std::vector<std::string> buildConfigs;

      // Try get configuration names given via `-C` CLI option
      cmExpandList(this->GetOption("CPACK_BUILD_CONFIG"), buildConfigs);

      // Remove duplicates
      std::sort(buildConfigs.begin(), buildConfigs.end());
      buildConfigs.erase(std::unique(buildConfigs.begin(), buildConfigs.end()),
                         buildConfigs.end());

      // Ensure we have at least one configuration.
      if (buildConfigs.empty()) {
        buildConfigs.emplace_back();
      }

      std::unique_ptr<cmGlobalGenerator> globalGenerator =
        this->MakefileMap->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGenerator);
      if (!globalGenerator) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Specified package generator not found. "
                      "CPACK_CMAKE_GENERATOR value is invalid."
                        << std::endl);
        return 0;
      }
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(globalGenerator->GetForceUnixPaths());

      // Run the installation for the selected build configurations
      for (auto const& buildConfig : buildConfigs) {
        if (!this->RunPreinstallTarget(project.ProjectName, project.Directory,
                                       globalGenerator.get(), buildConfig)) {
          return 0;
        }

        cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                      "- Install project: " << project.ProjectName << " ["
                                            << buildConfig << ']'
                                            << std::endl);
        // Run the installation for each component
        for (std::string const& component : componentsVector) {
          if (!this->InstallCMakeProject(
                setDestDir, project.Directory, baseTempInstallDirectory,
                default_dir_mode, component, componentInstall,
                project.SubDirectory, buildConfig, absoluteDestFiles)) {
            return 0;
          }
        }
      }

      this->CMakeProjects.emplace_back(std::move(project));
    }
  }
  this->SetOption("CPACK_ABSOLUTE_DESTINATION_FILES", absoluteDestFiles);
  return 1;
}